

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::apply::~apply(apply *this)

{
  apply *this_local;
  
  ~apply(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      build_apply();
      TEST_EQ("0", run("(apply + ())"));
      TEST_EQ("7", run("(apply + (list 3 4))"));
      TEST_EQ("10", run("(apply + (list 1 2 3 4))"));
      TEST_EQ("10", run("(apply + 1 2 (list 3 4))"));
      TEST_EQ("36", run("(apply + (list 1 2 3 4 5 6 7 8))"));
      TEST_EQ("45", run("(apply + (list 1 2 3 4 5 6 7 8 9))"));
      TEST_EQ("55", run("(apply + (list 1 2 3 4 5 6 7 8 9 10))"));
      TEST_EQ("55", run("(%apply + 1 2 3 4 5 6 7 8 9 (list 10))"));

      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector '(1 2 3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 '(2 3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 '(3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 '(4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 '(5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 '(6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 '(7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 7 '(8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 7 8 ()) '())"));

      TEST_EQ("13", run("(let([f(lambda() 12)])( + (apply f '()) 1))"));
      TEST_EQ("26", run("(let([f(lambda(x) ( + x 12))]) ( + (apply f 13 '()) 1))"));
      TEST_EQ("26", run("(let([f(lambda(x) ( + x 12))]) ( + (apply f(cons 13 '())) 1))"));
      TEST_EQ("27", run("(let([f(lambda(x y z) ( + x(* y z)))])( + (apply f 12 '(7 2)) 1))"));

      TEST_EQ("12", run("(let([f(lambda() 12)])(apply f '()))"));
      TEST_EQ("25", run("(let([f(lambda(x) ( + x 12))])(apply f 13 '()))"));
      TEST_EQ("25", run("(let([f(lambda(x) ( + x 12))])(apply f(cons 13 '())))"));
      TEST_EQ("26", run("(let([f(lambda(x y z) ( + x(* y z)))])(apply f 12 '(7 2)))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector '(1 2 3 4 5 6 7 8))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 '(2 3 4 5 6 7 8))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 '(3 4 5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 '(4 5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 '(5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 '(6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 '(7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 7 '(8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 7 8 ())"));


      TEST_EQ("<lambda>", run("(define compose (lambda(f g)(lambda args(f(apply g args)))))"));
      TEST_EQ("<lambda>", run("(define twice (lambda (x) (* 2 x)))"));
      TEST_EQ("1800", run("((compose twice *) 12 75)"));
      }